

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

int Abc_SclCountMaxPhases(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Abc_Obj_t *p_00;
  int iVar4;
  long lVar5;
  int Entry;
  int i;
  
  p = Vec_IntStart(pNtk->vObjs->nSize);
  iVar4 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    p_00 = Abc_NtkObj(pNtk,i);
    if (((p_00 != (Abc_Obj_t *)0x0) && (uVar1 = *(uint *)&p_00->field_0x14 & 0xf, uVar1 < 8)) &&
       ((0x98U >> uVar1 & 1) != 0)) {
      Entry = 0;
      for (lVar5 = 0; lVar5 < (p_00->vFanins).nSize; lVar5 = lVar5 + 1) {
        iVar2 = Vec_IntEntry(p,*(int *)((long)p_00->pNtk->vObjs->pArray
                                              [(p_00->vFanins).pArray[lVar5]] + 0x10));
        iVar3 = Abc_ObjFaninPhase(p_00,(int)lVar5);
        if (Entry <= iVar3 + iVar2) {
          Entry = iVar3 + iVar2;
        }
      }
      Vec_IntWriteEntry(p,i,Entry);
      if (iVar4 <= Entry) {
        iVar4 = Entry;
      }
    }
  }
  Vec_IntFree(p);
  return iVar4;
}

Assistant:

int Abc_SclCountMaxPhases( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vPhLevel;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Max = 0, MaxAll = 0;
    vPhLevel = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        Max = 0;
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Max = Abc_MaxInt( Max, Vec_IntEntry(vPhLevel, Abc_ObjId(pFanin)) + Abc_ObjFaninPhase(pObj, k) );
        Vec_IntWriteEntry( vPhLevel, i, Max );
        MaxAll = Abc_MaxInt( MaxAll, Max );
    }
    Vec_IntFree( vPhLevel );
    return MaxAll;
}